

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp_number.hpp
# Opt level: O2

self_ * __thiscall standards::exp_number<float>::operator/=(exp_number<float> *this,self_ *rhs)

{
  int iVar1;
  range_error *this_00;
  float fVar2;
  
  if (this->sign_ != 0) {
    iVar1 = rhs->sign_;
    if (iVar1 == 0) {
      this_00 = (range_error *)__cxa_allocate_exception(0x10);
      std::range_error::range_error(this_00,"exp_number::operator/=()");
      __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
    }
    fVar2 = this->log_ - rhs->log_;
    this->log_ = fVar2;
    this->sign_ = iVar1 * this->sign_;
    if (ABS(fVar2 / rhs->log_) < 1e-10) {
      this->log_ = 0.0;
    }
  }
  return this;
}

Assistant:

self_& operator/=(self_ const& rhs) {
    if (sign_ != is_zero) {
      if (rhs.sign_ != is_zero) {
        log_ -= rhs.log_;
        sign_ *= rhs.sign_;
        if (std::abs(log_/rhs.log_) < 1.0e-10) log_ = 0;
      } else {
        throw std::range_error("exp_number::operator/=()");
      }
    }
    return *this;
  }